

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O1

int __thiscall crnlib::console::vprintf(console *this,char *__format,__gnuc_va_list __arg)

{
  bool bVar1;
  bool bVar2;
  mutex *this_00;
  char cVar3;
  int extraout_EAX;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  dynamic_string tmp_buf;
  char buf [4096];
  dynamic_string local_1048;
  char local_1038 [4104];
  
  init((EVP_PKEY_CTX *)this);
  this_00 = m_pMutex;
  mutex::lock(m_pMutex);
  iVar6 = (int)this;
  *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) =
       *(int *)(m_num_messages + ((ulong)this & 0xffffffff) * 4) + 1;
  vsprintf_s(local_1038,0x1000,__format,(__va_list_tag *)__arg);
  if (DAT_001c6858 == 0) {
    bVar2 = false;
  }
  else {
    lVar8 = 8;
    uVar9 = 0;
    bVar2 = false;
    do {
      cVar3 = (**(code **)(m_output_funcs + -8 + lVar8))
                        ((ulong)this & 0xffffffff,local_1038,*(undefined8 *)(m_output_funcs + lVar8)
                        );
      if (cVar3 != '\0') {
        bVar2 = true;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < DAT_001c6858);
  }
  bVar1 = true;
  if ((m_prefixes == '\x01') && (m_at_beginning_of_line == '\x01')) {
    if (iVar6 == 6) {
      pcVar7 = "Error: ";
    }
    else if (iVar6 == 5) {
      pcVar7 = "Warning: ";
    }
    else {
      if (iVar6 != 0) goto LAB_0010fc25;
      pcVar7 = "Debug: ";
    }
    bVar1 = false;
  }
  else {
LAB_0010fc25:
    pcVar7 = (char *)0x0;
  }
  if (!bVar2 && (m_output_disabled & 1) == 0) {
    if (!bVar1) {
      ::printf("%s",pcVar7);
    }
    pcVar7 = "%s";
    if (m_crlf != '\0') {
      pcVar7 = "%s\n";
    }
    ::printf(pcVar7,local_1038);
  }
  sVar4 = strlen(local_1038);
  m_at_beginning_of_line = true;
  if (m_crlf == '\0') {
    if ((int)sVar4 == 0) {
      m_at_beginning_of_line = false;
    }
    else {
      m_at_beginning_of_line = local_1038[(int)sVar4 - 1] == '\n';
    }
  }
  if ((iVar6 != 1) && (m_pLog_stream != (data_stream *)0x0)) {
    dynamic_string::dynamic_string(&local_1048,local_1038);
    dynamic_string::translate_lf_to_crlf(&local_1048);
    pcVar7 = "%s";
    if (m_crlf != '\0') {
      pcVar7 = "%s\r\n";
    }
    pcVar5 = "";
    if (local_1048.m_pStr != (char *)0x0) {
      pcVar5 = local_1048.m_pStr;
    }
    data_stream::printf(m_pLog_stream,pcVar7,pcVar5);
    (*m_pLog_stream->_vptr_data_stream[7])();
    if ((local_1048.m_pStr != (char *)0x0) &&
       ((*(uint *)(local_1048.m_pStr + -8) ^ *(uint *)(local_1048.m_pStr + -4)) == 0xffffffff)) {
      crnlib_free(local_1048.m_pStr + -0x10);
    }
  }
  mutex::unlock(this_00);
  return extraout_EAX;
}

Assistant:

void console::vprintf(eConsoleMessageType type, const char* p, va_list args) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_num_messages[type]++;

  char buf[cConsoleBufSize];
  vsprintf_s(buf, cConsoleBufSize, p, args);

  bool handled = false;

  if (m_output_funcs.size()) {
    for (uint i = 0; i < m_output_funcs.size(); i++)
      if (m_output_funcs[i].m_func(type, buf, m_output_funcs[i].m_pData))
        handled = true;
  }

  const char* pPrefix = NULL;
  if ((m_prefixes) && (m_at_beginning_of_line)) {
    switch (type) {
      case cDebugConsoleMessage:
        pPrefix = "Debug: ";
        break;
      case cWarningConsoleMessage:
        pPrefix = "Warning: ";
        break;
      case cErrorConsoleMessage:
        pPrefix = "Error: ";
        break;
      default:
        break;
    }
  }

  if ((!m_output_disabled) && (!handled)) {
    if (pPrefix)
      ::printf("%s", pPrefix);
    ::printf(m_crlf ? "%s\n" : "%s", buf);
  }

  uint n = strlen(buf);
  m_at_beginning_of_line = (m_crlf) || ((n) && (buf[n - 1] == '\n'));

  if ((type != cProgressConsoleMessage) && (m_pLog_stream)) {
    // Yes this is bad.
    dynamic_string tmp_buf(buf);

    tmp_buf.translate_lf_to_crlf();

    m_pLog_stream->printf(m_crlf ? "%s\r\n" : "%s", tmp_buf.get_ptr());
    m_pLog_stream->flush();
  }
}